

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

Result __thiscall
presolve::HPresolve::colPresolve(HPresolve *this,HighsPostsolveStack *postsolve_stack,HighsInt col)

{
  double dVar1;
  HighsLp *pHVar2;
  pointer piVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  Result RVar7;
  HighsInt HVar8;
  long lVar9;
  int iVar10;
  double *pdVar11;
  long lVar12;
  HighsInt *pHVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  HighsMatrixSlice<HighsTripletListSlice> local_50;
  
  pHVar2 = this->model;
  dVar1 = (pHVar2->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[col];
  dVar14 = (pHVar2->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[col] - dVar1;
  dVar15 = this->primal_feastol;
  if (dVar14 <= dVar15) {
    if (dVar14 <= (this->options->super_HighsOptionsStruct).small_matrix_value) {
LAB_00318879:
      if (-dVar15 <= dVar14) {
        local_50.nodeValue =
             (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_50.nodeIndex =
             (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_50.nodeNext =
             (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_50.head =
             (this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[col];
        HighsPostsolveStack::removedFixedCol<HighsTripletListSlice>
                  (postsolve_stack,col,dVar1,
                   (pHVar2->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[col],&local_50);
        removeFixedCol(this,col);
        RVar7 = checkLimits(this,postsolve_stack);
        return RVar7;
      }
      return kPrimalInfeasible;
    }
    lVar12 = (long)(this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[col];
    if (lVar12 == -1) {
      dVar16 = 0.0;
    }
    else {
      pdVar11 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + lVar12;
      dVar16 = 0.0;
      do {
        if (dVar16 <= ABS(*pdVar11)) {
          dVar16 = ABS(*pdVar11);
        }
        iVar10 = (int)lVar12;
        lVar12 = (long)(this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar10];
        pdVar11 = pdVar11 + (lVar12 - iVar10);
      } while (lVar12 != -1);
    }
    if (dVar16 * dVar14 <= dVar15) goto LAB_00318879;
  }
  iVar10 = (this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[col];
  if (iVar10 == 1) {
    RVar7 = singletonCol(this,postsolve_stack,col);
    return RVar7;
  }
  if (iVar10 == 0) {
    RVar7 = emptyCol(this,postsolve_stack,col);
    return RVar7;
  }
  RVar7 = detectDominatedCol(this,postsolve_stack,col,true);
  if (RVar7 != kOk) {
    return RVar7;
  }
  if ((this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[col] != '\0') {
    return kOk;
  }
  pHVar2 = this->model;
  dVar1 = (pHVar2->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[col];
  bVar5 = true;
  bVar4 = true;
  if (dVar1 < INFINITY) {
    bVar4 = (this->implColUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[col] <= dVar1 + this->primal_feastol;
  }
  dVar1 = (pHVar2->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[col];
  if (-INFINITY < dVar1) {
    bVar5 = dVar1 - this->primal_feastol <=
            (this->implColLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[col];
  }
  if (this->mipsolver == (HighsMipSolver *)0x0) goto LAB_00318c90;
  if (bVar5) {
    iVar10 = (this->colLowerSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[col];
    lVar12 = (long)iVar10;
    if (((((lVar12 != -1) &&
          ((this->impliedDualRowBounds).numInfSumUpperOrig.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           [col] == 1)) &&
         (0.0 <= (pHVar2->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[col])) &&
        (((pHVar2->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar12] <= -INFINITY ||
         (INFINITY <=
          (pHVar2->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar12])))) &&
       ((HVar8 = findNonzero(this,iVar10,col),
        (this->model->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
        _M_impl.super__Vector_impl_data._M_start[col] != kInteger ||
        (((this->rowsizeInteger).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar12] ==
          (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar12] &&
         (bVar6 = rowCoefficientsIntegral
                            (this,iVar10,
                             1.0 / (this->Avalue).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start[HVar8]), bVar6)))))) {
      if ((this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[HVar8] <= 0.0) {
        changeImplRowDualUpper(this,iVar10,0.0,col);
      }
      else {
        changeImplRowDualLower(this,iVar10,0.0,col);
      }
    }
  }
  if (bVar4) {
    iVar10 = (this->colUpperSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[col];
    lVar12 = (long)iVar10;
    if ((((lVar12 != -1) &&
         ((this->impliedDualRowBounds).numInfSumLowerOrig.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [col] == 1)) &&
        (pHVar2 = this->model,
        (pHVar2->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[col] <= 0.0)) &&
       ((((pHVar2->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar12] <= -INFINITY ||
         (INFINITY <=
          (pHVar2->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar12])) &&
        ((HVar8 = findNonzero(this,iVar10,col),
         (this->model->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>
         ._M_impl.super__Vector_impl_data._M_start[col] != kInteger ||
         (((this->rowsizeInteger).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[lVar12] ==
           (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[lVar12] &&
          (bVar6 = rowCoefficientsIntegral
                             (this,iVar10,
                              1.0 / (this->Avalue).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start[HVar8]), bVar6)))))))) {
      if ((this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[HVar8] <= 0.0) {
        changeImplRowDualLower(this,iVar10,0.0,col);
      }
      else {
        changeImplRowDualUpper(this,iVar10,0.0,col);
      }
    }
  }
  convertImpliedInteger(this,col,-1,false);
  pHVar2 = this->model;
  if ((pHVar2->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl
      .super__Vector_impl_data._M_start[col] != kContinuous) {
    dVar1 = (pHVar2->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[col];
    if ((((dVar1 != 0.0) || (NAN(dVar1))) &&
        ((-INFINITY < dVar1 ||
         ((pHVar2->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[col] < INFINITY)))) &&
       (dVar15 = (pHVar2->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[col], 0.5 < dVar15 - dVar1)) {
      if (ABS(dVar15) <= ABS(dVar1)) {
        if (ABS(dVar15) < 1000.5) {
          dVar14 = -1.0;
          goto LAB_00318c72;
        }
      }
      else if (ABS(dVar1) < 1000.5) {
        dVar14 = 1.0;
        dVar15 = dVar1;
LAB_00318c72:
        transformColumn(this,postsolve_stack,col,dVar14,dVar15);
      }
    }
  }
  if ((this->model->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
      _M_impl.super__Vector_impl_data._M_start[col] == kInteger) {
    return kOk;
  }
LAB_00318c90:
  if ((((bVar5) &&
       ((this->impliedDualRowBounds).numInfSumUpper.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_start[col] < 2)) ||
      ((bVar4 && ((this->impliedDualRowBounds).numInfSumLower.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[col] < 2)))) &&
     (lVar12 = (long)(this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[col], lVar12 != -1)) {
    piVar3 = (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar11 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + lVar12;
    pHVar13 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + lVar12;
    do {
      updateRowDualImpliedBounds(this,*pHVar13,col,*pdVar11);
      lVar9 = (long)(int)lVar12;
      lVar12 = (long)piVar3[lVar9];
      pHVar13 = pHVar13 + (lVar12 - lVar9);
      pdVar11 = pdVar11 + (lVar12 - lVar9);
    } while (lVar12 != -1);
  }
  return kOk;
}

Assistant:

HPresolve::Result HPresolve::colPresolve(HighsPostsolveStack& postsolve_stack,
                                         HighsInt col) {
  assert(!colDeleted[col]);
  const bool logging_on = analysis_.logging_on_;
  double boundDiff = model->col_upper_[col] - model->col_lower_[col];
  if (boundDiff <= primal_feastol) {
    if (boundDiff <= options->small_matrix_value ||
        getMaxAbsColVal(col) * boundDiff <= primal_feastol) {
      if (boundDiff < -primal_feastol) return Result::kPrimalInfeasible;
      postsolve_stack.removedFixedCol(col, model->col_lower_[col],
                                      model->col_cost_[col],
                                      getColumnVector(col));
      removeFixedCol(col);
      return checkLimits(postsolve_stack);
    }
  }

  switch (colsize[col]) {
    case 0:
      return emptyCol(postsolve_stack, col);
    case 1:
      return singletonCol(postsolve_stack, col);
    default:
      break;
  }

  // detect strong / weak domination
  HPRESOLVE_CHECKED_CALL(detectDominatedCol(postsolve_stack, col));
  if (colDeleted[col]) return Result::kOk;

  // column is not (weakly) dominated

  // the associated dual constraint has an upper bound if there is an infinite
  // or redundant column lower bound as then the reduced cost of the column must
  // not be positive i.e. <= 0
  bool dualConsHasUpper = isUpperImplied(col);
  bool dualConsHasLower = isLowerImplied(col);

  // integer columns cannot be used to tighten bounds on dual multipliers
  if (mipsolver != nullptr) {
    if (dualConsHasLower && colLowerSource[col] != -1 &&
        impliedDualRowBounds.getNumInfSumUpperOrig(col) == 1 &&
        model->col_cost_[col] >= 0) {
      HighsInt row = colLowerSource[col];

      if (model->row_lower_[row] == -kHighsInf ||
          model->row_upper_[row] == kHighsInf) {
        HighsInt nzPos = findNonzero(row, col);

        if (model->integrality_[col] != HighsVarType::kInteger ||
            (rowsizeInteger[row] == rowsize[row] &&
             rowCoefficientsIntegral(row, 1.0 / Avalue[nzPos]))) {
          if (Avalue[nzPos] > 0)
            changeImplRowDualLower(row, 0.0, col);
          else
            changeImplRowDualUpper(row, 0.0, col);
        }
      }
    }

    if (dualConsHasUpper && colUpperSource[col] != -1 &&
        impliedDualRowBounds.getNumInfSumLowerOrig(col) == 1 &&
        model->col_cost_[col] <= 0) {
      HighsInt row = colUpperSource[col];

      if (model->row_lower_[row] == -kHighsInf ||
          model->row_upper_[row] == kHighsInf) {
        HighsInt nzPos = findNonzero(row, col);

        if (model->integrality_[col] != HighsVarType::kInteger ||
            (rowsizeInteger[row] == rowsize[row] &&
             rowCoefficientsIntegral(row, 1.0 / Avalue[nzPos]))) {
          if (Avalue[nzPos] > 0)
            changeImplRowDualUpper(row, 0.0, col);
          else
            changeImplRowDualLower(row, 0.0, col);
        }
      }
    }

    convertImpliedInteger(col);

    // shift integral variables to have a lower bound of zero
    if (model->integrality_[col] != HighsVarType::kContinuous &&
        model->col_lower_[col] != 0.0 &&
        (model->col_lower_[col] != -kHighsInf ||
         model->col_upper_[col] != kHighsInf) &&
        model->col_upper_[col] - model->col_lower_[col] > 0.5) {
      // substitute with the bound that is smaller in magnitude and only
      // substitute if bound is not large for an integer
      if (std::abs(model->col_upper_[col]) > std::abs(model->col_lower_[col])) {
        if (std::abs(model->col_lower_[col]) < 1000.5)
          transformColumn(postsolve_stack, col, 1.0, model->col_lower_[col]);
      } else {
        if (std::abs(model->col_upper_[col]) < 1000.5)
          transformColumn(postsolve_stack, col, -1.0, model->col_upper_[col]);
      }
    }

    if (model->integrality_[col] == HighsVarType::kInteger) return Result::kOk;
  }

  // now check if we can expect to tighten at least one bound
  if ((dualConsHasLower && impliedDualRowBounds.getNumInfSumUpper(col) <= 1) ||
      (dualConsHasUpper && impliedDualRowBounds.getNumInfSumLower(col) <= 1)) {
    for (const HighsSliceNonzero& nonzero : getColumnVector(col))
      updateRowDualImpliedBounds(nonzero.index(), col, nonzero.value());
  }

  return Result::kOk;
}